

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsUniformBlockCase.cpp
# Opt level: O2

ostream * deqp::gls::ub::operator<<(ostream *str,PrecisionFlagsFmt *fmt)

{
  uint uVar1;
  bool *pbVar2;
  
  uVar1 = fmt->flags;
  if ((uVar1 & 1) == 0) {
    if ((uVar1 & 2) == 0) {
      pbVar2 = (bool *)0x180ebbf;
      if ((uVar1 & 4) == 0) {
        pbVar2 = glcts::fixed_sample_locations_values + 1;
      }
    }
    else {
      pbVar2 = (bool *)0x180ebcd;
    }
  }
  else {
    pbVar2 = (bool *)0x186490f;
  }
  std::operator<<(str,pbVar2);
  return str;
}

Assistant:

std::ostream& operator<< (std::ostream& str, const PrecisionFlagsFmt& fmt)
{
	// Precision.
	DE_ASSERT(dePop32(fmt.flags & (PRECISION_LOW|PRECISION_MEDIUM|PRECISION_HIGH)) <= 1);
	str << (fmt.flags & PRECISION_LOW		? "lowp"	:
			fmt.flags & PRECISION_MEDIUM	? "mediump"	:
			fmt.flags & PRECISION_HIGH		? "highp"	: "");
	return str;
}